

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliLZ77Greedy(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     ZopfliLZ77Store *store,ZopfliHash *h)

{
  int iVar1;
  long lVar2;
  uint uVar4;
  unsigned_short length;
  uint uVar5;
  uint uVar6;
  ulong pos;
  unsigned_short leng;
  uint local_260;
  uint local_25c;
  int local_258;
  unsigned_short dist;
  ZopfliLZ77Store *local_250;
  uint local_244;
  ZopfliBlockState *local_240;
  unsigned_short dummysublen [259];
  size_t sVar3;
  
  if (instart != inend) {
    pos = 0;
    if (0x7fff < instart) {
      pos = instart - 0x8000;
    }
    local_250 = store;
    local_240 = s;
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(in,pos,inend,h);
    if (pos < instart) {
      sVar3 = 0x8000;
      if (instart < 0x8000) {
        sVar3 = instart;
      }
      lVar2 = -sVar3;
      do {
        ZopfliUpdateHash(in,instart + lVar2,inend,h);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
    if (instart < inend) {
      local_258 = 0;
      uVar4 = 0;
      uVar5 = 0;
      do {
        local_260 = uVar4;
        local_25c = uVar5;
        ZopfliUpdateHash(in,instart,inend,h);
        ZopfliFindLongestMatch(local_240,h,in,instart,inend,0x102,dummysublen,&dist,&leng);
        length = leng;
        uVar5 = (uint)leng;
        iVar1 = (uVar5 - 1) + (uint)(dist < 0x401);
        uVar4 = (uint)dist;
        if (local_258 == 0) {
LAB_00125a98:
          local_258 = 1;
          if (iVar1 < 3 || 0x101 < uVar5) {
            if (iVar1 < 3) {
              leng = 1;
              length = (unsigned_short)in[instart];
              uVar4 = 0;
            }
            ZopfliStoreLitLenDist(length,(unsigned_short)uVar4,instart,local_250);
            local_258 = 0;
            uVar4 = local_260;
            uVar5 = local_25c;
            if (1 < (ulong)leng) {
              lVar2 = (ulong)leng - 1;
              do {
                instart = instart + 1;
                ZopfliUpdateHash(in,instart,inend,h);
                lVar2 = lVar2 + -1;
                uVar4 = local_260;
                uVar5 = local_25c;
              } while (lVar2 != 0);
            }
          }
        }
        else {
          if ((int)((local_25c - (0x400 < (int)local_260)) + 1) < iVar1) {
            local_244 = (uint)dist;
            ZopfliStoreLitLenDist((ushort)in[instart - 1],0,instart - 1,local_250);
            uVar4 = local_244;
            goto LAB_00125a98;
          }
          leng = (unsigned_short)local_25c;
          dist = (unsigned_short)local_260;
          uVar6 = local_25c & 0xffff;
          ZopfliStoreLitLenDist(leng,dist,instart - 1,local_250);
          local_258 = 0;
          uVar4 = local_260;
          uVar5 = local_25c;
          if (2 < uVar6) {
            lVar2 = (ulong)uVar6 - 2;
            do {
              instart = instart + 1;
              ZopfliUpdateHash(in,instart,inend,h);
              lVar2 = lVar2 + -1;
              uVar4 = local_260;
              uVar5 = local_25c;
            } while (lVar2 != 0);
          }
        }
        instart = instart + 1;
      } while (instart < inend);
    }
  }
  return;
}

Assistant:

void ZopfliLZ77Greedy(ZopfliBlockState* s, const unsigned char* in,
                      size_t instart, size_t inend,
                      ZopfliLZ77Store* store, ZopfliHash* h) {
  size_t i = 0, j;
  unsigned short leng;
  unsigned short dist;
  int lengthscore;
  size_t windowstart = instart > ZOPFLI_WINDOW_SIZE
      ? instart - ZOPFLI_WINDOW_SIZE : 0;
  unsigned short dummysublen[259];

#ifdef ZOPFLI_LAZY_MATCHING
  /* Lazy matching. */
  unsigned prev_length = 0;
  unsigned prev_match = 0;
  int prevlengthscore;
  int match_available = 0;
#endif

  if (instart == inend) return;

  ZopfliResetHash(ZOPFLI_WINDOW_SIZE, h);
  ZopfliWarmupHash(in, windowstart, inend, h);
  for (i = windowstart; i < instart; i++) {
    ZopfliUpdateHash(in, i, inend, h);
  }

  for (i = instart; i < inend; i++) {
    ZopfliUpdateHash(in, i, inend, h);

    ZopfliFindLongestMatch(s, h, in, i, inend, ZOPFLI_MAX_MATCH, dummysublen,
                           &dist, &leng);
    lengthscore = GetLengthScore(leng, dist);

#ifdef ZOPFLI_LAZY_MATCHING
    /* Lazy matching. */
    prevlengthscore = GetLengthScore(prev_length, prev_match);
    if (match_available) {
      match_available = 0;
      if (lengthscore > prevlengthscore + 1) {
        ZopfliStoreLitLenDist(in[i - 1], 0, i - 1, store);
        if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
          match_available = 1;
          prev_length = leng;
          prev_match = dist;
          continue;
        }
      } else {
        /* Add previous to output. */
        leng = prev_length;
        dist = prev_match;
        lengthscore = prevlengthscore;
        /* Add to output. */
        ZopfliVerifyLenDist(in, inend, i - 1, dist, leng);
        ZopfliStoreLitLenDist(leng, dist, i - 1, store);
        for (j = 2; j < leng; j++) {
          assert(i < inend);
          i++;
          ZopfliUpdateHash(in, i, inend, h);
        }
        continue;
      }
    }
    else if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
      match_available = 1;
      prev_length = leng;
      prev_match = dist;
      continue;
    }
    /* End of lazy matching. */
#endif

    /* Add to output. */
    if (lengthscore >= ZOPFLI_MIN_MATCH) {
      ZopfliVerifyLenDist(in, inend, i, dist, leng);
      ZopfliStoreLitLenDist(leng, dist, i, store);
    } else {
      leng = 1;
      ZopfliStoreLitLenDist(in[i], 0, i, store);
    }
    for (j = 1; j < leng; j++) {
      assert(i < inend);
      i++;
      ZopfliUpdateHash(in, i, inend, h);
    }
  }
}